

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O3

ssize_t nw_in_recv(void *reader_ctx,uchar *buf,size_t buflen,CURLcode *err)

{
  CURLcode CVar1;
  ulong in_RAX;
  size_t nread;
  ulong local_18;
  
  local_18 = in_RAX;
  CVar1 = curl_easy_recv(reader_ctx,buf,buflen,&local_18);
  *err = CVar1;
  return -(ulong)(CVar1 != CURLE_OK) | local_18;
}

Assistant:

static ssize_t nw_in_recv(void *reader_ctx,
                          unsigned char *buf, size_t buflen,
                          CURLcode *err)
{
  struct Curl_easy *data = reader_ctx;
  size_t nread;

  *err = curl_easy_recv(data, buf, buflen, &nread);
  if(*err)
    return -1;
  return (ssize_t)nread;
}